

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O3

int cmd_feature(char *arg)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  uint8_t *puVar6;
  char *pcVar7;
  long lVar8;
  long *__ptr;
  undefined8 *__ptr_00;
  uint8_t *__s;
  uint uVar9;
  size_t sVar10;
  char *local_58;
  undefined4 local_4c;
  void *pvStack_48;
  int option_index;
  uint8_t *states;
  undefined8 *local_38;
  
  puVar4 = (undefined8 *)malloc(0x10);
  pcVar5 = strdup(arg);
  *puVar4 = pcVar5;
  strtok(pcVar5," ");
  states = (uint8_t *)0x0;
  pcVar5 = strtok((char *)0x0," ");
  if (pcVar5 == (char *)0x0) {
    uVar9 = 1;
  }
  else {
    sVar10 = 0x18;
    uVar9 = 1;
    __ptr_00 = puVar4;
    do {
      puVar4 = (undefined8 *)realloc(__ptr_00,sVar10);
      if (puVar4 == (undefined8 *)0x0) {
        cmd_feature_cold_1();
        goto LAB_00109b35;
      }
      *(char **)((long)puVar4 + (sVar10 - 0x10)) = pcVar5;
      pcVar5 = strtok((char *)0x0," ");
      sVar10 = sVar10 + 8;
      uVar9 = uVar9 + 1;
      __ptr_00 = puVar4;
    } while (pcVar5 != (char *)0x0);
  }
  puVar4[uVar9] = 0;
  _optind = 0;
  local_58 = (char *)0x0;
  local_38 = puVar4;
  do {
    while( true ) {
      local_4c = 0;
      iVar3 = getopt_long(uVar9,local_38,"he:d:",cmd_feature::long_options,&local_4c);
      if (iVar3 < 0x65) break;
      if (iVar3 == 0x65) {
        puVar6 = (uint8_t *)0x1;
        if ((int)states != 0) {
          cmd_feature_cold_4();
          __ptr_00 = local_38;
          goto LAB_00109b35;
        }
LAB_001098dd:
        local_58 = _optarg;
        states = puVar6;
      }
      else if (iVar3 == 0x68) {
        puts(
            "feature [ -(-e)nable | -(-d)isable (* | <feature-name>[,<feature-name> ...]) ] <model-name>[@<revision>]"
            );
        iVar3 = 0;
        __ptr_00 = local_38;
        goto LAB_00109afc;
      }
    }
    if (iVar3 == -1) {
      if (_optind == uVar9) {
        cmd_feature_cold_5();
        __ptr_00 = local_38;
        goto LAB_00109b35;
      }
      pcVar5 = (char *)local_38[(int)_optind];
      pcVar7 = strchr(pcVar5,0x40);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)0x0;
      }
      else {
        *pcVar7 = '\0';
        pcVar7 = pcVar7 + 1;
      }
      lVar8 = ly_ctx_get_module(ctx,pcVar5,pcVar7,0);
      if ((lVar8 != 0) || (lVar8 = ly_ctx_get_submodule(ctx,0,0,pcVar5,pcVar7), lVar8 != 0)) {
        if ((int)states == 0) {
          uVar9 = 0;
          printf("%s features:\n",*(undefined8 *)(lVar8 + 8));
          __ptr = (long *)lys_features_list(lVar8,&stack0xffffffffffffffb8);
          puVar6 = (uint8_t *)*__ptr;
          __s = puVar6;
          plVar1 = __ptr;
          if (puVar6 != (uint8_t *)0x0) goto LAB_00109a43;
          goto LAB_00109ad5;
        }
        pcVar5 = strtok(local_58,",");
        goto joined_r0x0010999a;
      }
      if (pcVar7 == (char *)0x0) {
        fprintf(_stderr,"No (sub)module \"%s\" found.\n",pcVar5);
      }
      else {
        fprintf(_stderr,"No (sub)module \"%s\" in revision %s found.\n",pcVar5,pcVar7);
      }
      goto LAB_00109af8;
    }
    if (iVar3 == 100) {
      puVar6 = (uint8_t *)0x2;
      if ((int)states == 0) goto LAB_001098dd;
      cmd_feature_cold_3();
      __ptr_00 = local_38;
      goto LAB_00109b35;
    }
  } while (iVar3 != 0x3f);
  cmd_feature_cold_2();
  __ptr_00 = local_38;
LAB_00109b35:
  iVar3 = 1;
  goto LAB_00109afc;
joined_r0x0010999a:
  if (pcVar5 == (char *)0x0) goto LAB_00109af8;
  if ((int)states == 2) {
    iVar3 = lys_features_disable(lVar8,pcVar5);
LAB_001099d7:
    if (iVar3 != 0) {
      fprintf(_stderr,"Feature \"%s\" not found.\n",pcVar5);
    }
  }
  else if ((int)states == 1) {
    iVar3 = lys_features_enable(lVar8,pcVar5);
    goto LAB_001099d7;
  }
  pcVar5 = strtok((char *)0x0,",");
  goto joined_r0x0010999a;
LAB_00109a43:
  do {
    sVar10 = strlen((char *)__s);
    uVar2 = (uint)sVar10;
    if (sVar10 <= uVar9) {
      uVar2 = uVar9;
    }
    uVar9 = uVar2;
    __s = (uint8_t *)plVar1[1];
    plVar1 = plVar1 + 1;
  } while (__s != (uint8_t *)0x0);
  if (puVar6 == (uint8_t *)0x0) {
LAB_00109ad5:
    free(__ptr);
    free(pvStack_48);
LAB_00109ae6:
    puts("\t(none)");
  }
  else {
    lVar8 = 1;
    states = puVar6;
    do {
      pcVar5 = "on";
      if (*(char *)((long)pvStack_48 + lVar8 + -1) == '\0') {
        pcVar5 = "off";
      }
      printf("\t%-*s (%s)\n",(ulong)uVar9,puVar6,pcVar5);
      puVar6 = (uint8_t *)__ptr[lVar8];
      lVar8 = lVar8 + 1;
    } while (puVar6 != (uint8_t *)0x0);
    free(__ptr);
    free(pvStack_48);
    if (states == (uint8_t *)0x0) goto LAB_00109ae6;
  }
LAB_00109af8:
  iVar3 = 1;
  __ptr_00 = local_38;
LAB_00109afc:
  free((void *)*__ptr_00);
  free(__ptr_00);
  return iVar3;
}

Assistant:

int
cmd_feature(const char *arg)
{
    int c, i, argc, option_index, ret = 1, task = 0;
    unsigned int max_len;
    char **argv = NULL, *ptr, *model_name, *revision, *feat_names = NULL;
    const char **names;
    uint8_t *states;
    const struct lys_module *module;
    static struct option long_options[] = {
        {"help", no_argument, 0, 'h'},
        {"enable", required_argument, 0, 'e'},
        {"disable", required_argument, 0, 'd'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc + 2) * sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "he:d:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'h':
            cmd_feature_help();
            ret = 0;
            goto cleanup;
        case 'e':
            if (task) {
                fprintf(stderr, "Only one of enable or disable can be specified.\n");
                goto cleanup;
            }
            task = 1;
            feat_names = optarg;
            break;
        case 'd':
            if (task) {
                fprintf(stderr, "Only one of enable, or disable can be specified.\n");
                goto cleanup;
            }
            task = 2;
            feat_names = optarg;
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* module name */
    if (optind == argc) {
        fprintf(stderr, "Missing the module name.\n");
        goto cleanup;
    }

    revision = NULL;
    model_name = argv[optind];
    if (strchr(model_name, '@')) {
        revision = strchr(model_name, '@');
        revision[0] = '\0';
        ++revision;
    }

    module = ly_ctx_get_module(ctx, model_name, revision, 0);
    if (!module) {
        /* not a module, try to find it as a submodule */
        module = (const struct lys_module *)ly_ctx_get_submodule(ctx, NULL, NULL, model_name, revision);
    }

    if (module == NULL) {
        if (revision) {
            fprintf(stderr, "No (sub)module \"%s\" in revision %s found.\n", model_name, revision);
        } else {
            fprintf(stderr, "No (sub)module \"%s\" found.\n", model_name);
        }
        goto cleanup;
    }

    if (!task) {
        printf("%s features:\n", module->name);

        names = lys_features_list(module, &states);

        /* get the max len */
        max_len = 0;
        for (i = 0; names[i]; ++i) {
            if (strlen(names[i]) > max_len) {
                max_len = strlen(names[i]);
            }
        }
        for (i = 0; names[i]; ++i) {
            printf("\t%-*s (%s)\n", max_len, names[i], states[i] ? "on" : "off");
        }
        free(names);
        free(states);
        if (!i) {
            printf("\t(none)\n");
        }
    } else {
        feat_names = strtok(feat_names, ",");
        while (feat_names) {
            if (((task == 1) && lys_features_enable(module, feat_names))
                    || ((task == 2) && lys_features_disable(module, feat_names))) {
                fprintf(stderr, "Feature \"%s\" not found.\n", feat_names);
                ret = 1;
            }
            feat_names = strtok(NULL, ",");
        }
    }

cleanup:
    free(*argv);
    free(argv);

    return ret;
}